

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int reparse_expr(lyxp_expr *exp,uint16_t *exp_idx)

{
  ushort repeat_op_idx;
  int iVar1;
  uint16_t uVar2;
  uint16_t exp_idx_00;
  
  exp_idx_00 = *exp_idx;
  do {
    iVar1 = reparse_equality_expr(exp,exp_idx);
    uVar2 = exp_idx_00;
    if (iVar1 != 0) {
      return -1;
    }
    while( true ) {
      repeat_op_idx = *exp_idx;
      if (exp->used == repeat_op_idx) {
        return 0;
      }
      if (exp->tokens[repeat_op_idx] != LYXP_TOKEN_OPERATOR_LOG) {
        return 0;
      }
      if (exp->tok_len[repeat_op_idx] != '\x03') break;
      exp_repeat_push(exp,uVar2,repeat_op_idx);
      uVar2 = *exp_idx;
      *exp_idx = uVar2 + 1;
      iVar1 = reparse_equality_expr(exp,exp_idx);
      uVar2 = uVar2 + 1;
      if (iVar1 != 0) {
        return -1;
      }
    }
    if (exp->tok_len[repeat_op_idx] != '\x02') {
      return 0;
    }
    exp_repeat_push(exp,exp_idx_00,repeat_op_idx);
    exp_idx_00 = *exp_idx + 1;
    *exp_idx = exp_idx_00;
  } while( true );
}

Assistant:

static int
reparse_expr(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_or_exp, prev_and_exp;

    goto reparse_equality_expr;

    /* ('or' AndExpr)* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_LOG, 0) && (exp->tok_len[*exp_idx] == 2)) {
        exp_repeat_push(exp, prev_or_exp, *exp_idx);
        ++(*exp_idx);

reparse_equality_expr:
        prev_or_exp = *exp_idx;
        prev_and_exp = *exp_idx;

        /* EqualityExpr */
        if (reparse_equality_expr(exp, exp_idx)) {
            return -1;
        }

        /* ('and' EqualityExpr)* */
        while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_LOG, 0) && (exp->tok_len[*exp_idx] == 3)) {
            exp_repeat_push(exp, prev_and_exp, *exp_idx);
            ++(*exp_idx);

            prev_and_exp = *exp_idx;
            if (reparse_equality_expr(exp, exp_idx)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}